

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Own<kj::_::ArrayJoinPromiseNode<void>,_kj::_::PromiseDisposer> __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::ArrayJoinPromiseNode<void>,kj::_::PromiseDisposer,kj::Array<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>,kj::Array<kj::_::ExceptionOr<kj::_::Void>>,kj::SourceLocation&,kj::_::ArrayJoinBehavior>
          (PromiseDisposer *this,Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *params
          ,Array<kj::_::ExceptionOr<kj::_::Void>_> *params_1,SourceLocation *params_2,
          ArrayJoinBehavior *params_3)

{
  void *pvVar1;
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *params_00;
  Array<kj::_::ExceptionOr<kj::_::Void>_> *params_1_00;
  SourceLocation *params_2_00;
  ArrayJoinBehavior *params_3_00;
  PromiseArena *arena;
  ArrayJoinPromiseNode<void> *ptr;
  ArrayJoinBehavior *params_local_3;
  SourceLocation *params_local_2;
  Array<kj::_::ExceptionOr<kj::_::Void>_> *params_local_1;
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *params_local;
  
  pvVar1 = operator_new(0x400);
  params_00 = fwd<kj::Array<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>>(params);
  params_1_00 = fwd<kj::Array<kj::_::ExceptionOr<kj::_::Void>>>(params_1);
  params_2_00 = fwd<kj::SourceLocation&>(params_2);
  params_3_00 = fwd<kj::_::ArrayJoinBehavior>(params_3);
  ctor<kj::_::ArrayJoinPromiseNode<void>,kj::Array<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>,kj::Array<kj::_::ExceptionOr<kj::_::Void>>,kj::SourceLocation&,kj::_::ArrayJoinBehavior>
            ((ArrayJoinPromiseNode<void> *)((long)pvVar1 + 0x3a8),params_00,params_1_00,params_2_00,
             params_3_00);
  *(void **)((long)pvVar1 + 0x3b0) = pvVar1;
  Own<kj::_::ArrayJoinPromiseNode<void>,_kj::_::PromiseDisposer>::Own
            ((Own<kj::_::ArrayJoinPromiseNode<void>,_kj::_::PromiseDisposer> *)this,
             (ArrayJoinPromiseNode<void> *)((long)pvVar1 + 0x3a8));
  return (Own<kj::_::ArrayJoinPromiseNode<void>,_kj::_::PromiseDisposer>)
         (ArrayJoinPromiseNode<void> *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }